

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

int ssl_parse_server_key_exchange(mbedtls_ssl_context *ssl)

{
  mbedtls_pk_type_t mVar1;
  mbedtls_ssl_context *ssl_00;
  byte bVar2;
  int iVar3;
  mbedtls_pk_type_t mVar4;
  size_t sVar5;
  uchar *puVar6;
  uchar *puVar7;
  size_t len;
  mbedtls_md_info_t *pmVar8;
  size_t local_1a0;
  undefined1 local_170 [8];
  mbedtls_md_context_t ctx;
  mbedtls_sha1_context mbedtls_sha1;
  mbedtls_md5_context mbedtls_md5;
  size_t params_len;
  uchar *params;
  mbedtls_pk_type_t pk_alg;
  mbedtls_md_type_t md_alg;
  uchar hash [64];
  size_t hashlen;
  size_t sig_len;
  uchar *end;
  uchar *p;
  mbedtls_ssl_ciphersuite_t *ciphersuite_info;
  mbedtls_ssl_context *pmStack_18;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  p = (uchar *)ssl->transform_negotiate->ciphersuite_info;
  pmStack_18 = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
             ,0x7ef,"=> parse server key exchange");
  if (*(int *)(p + 0x18) == 1) {
    mbedtls_debug_print_msg
              (pmStack_18,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x7f4,"<= skip parse server key exchange");
    pmStack_18->state = pmStack_18->state + 1;
    ssl_local._4_4_ = 0;
  }
  else if ((*(int *)(p + 0x18) == 9) || (*(int *)(p + 0x18) == 10)) {
    ciphersuite_info._4_4_ = ssl_get_ecdh_params_from_cert(pmStack_18);
    if (ciphersuite_info._4_4_ == 0) {
      mbedtls_debug_print_msg
                (pmStack_18,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x807,"<= skip parse server key exchange");
      pmStack_18->state = pmStack_18->state + 1;
      ssl_local._4_4_ = 0;
    }
    else {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x803,"ssl_get_ecdh_params_from_cert",ciphersuite_info._4_4_);
      ssl_local._4_4_ = ciphersuite_info._4_4_;
    }
  }
  else {
    ciphersuite_info._4_4_ = mbedtls_ssl_read_record(pmStack_18);
    if (ciphersuite_info._4_4_ == 0) {
      if (pmStack_18->in_msgtype == 0x16) {
        if (*pmStack_18->in_msg == '\f') {
          puVar6 = pmStack_18->in_msg;
          sVar5 = mbedtls_ssl_hs_hdr_len(pmStack_18);
          end = puVar6 + sVar5;
          puVar6 = pmStack_18->in_msg + pmStack_18->in_hslen;
          mbedtls_debug_print_buf
                    (pmStack_18,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                     ,0x82f,"server key exchange",end,(long)puVar6 - (long)end);
          if (((((*(int *)(p + 0x18) == 5) || (*(int *)(p + 0x18) == 7)) ||
               (*(int *)(p + 0x18) == 6)) || (*(int *)(p + 0x18) == 8)) &&
             (iVar3 = ssl_parse_server_psk_hint(pmStack_18,&end,puVar6), iVar3 != 0)) {
            mbedtls_debug_print_msg
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x839,"bad server key exchange message");
            return -0x7b00;
          }
          if ((*(int *)(p + 0x18) != 5) && (*(int *)(p + 0x18) != 7)) {
            if ((*(int *)(p + 0x18) == 2) || (*(int *)(p + 0x18) == 6)) {
              iVar3 = ssl_parse_server_dh_params(pmStack_18,&end,puVar6);
              if (iVar3 != 0) {
                mbedtls_debug_print_msg
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x84e,"bad server key exchange message");
                return -0x7b00;
              }
            }
            else {
              if (((*(int *)(p + 0x18) != 3) && (*(int *)(p + 0x18) != 8)) &&
                 (*(int *)(p + 0x18) != 4)) {
                mbedtls_debug_print_msg
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x867,"should never happen");
                return -0x6c00;
              }
              iVar3 = ssl_parse_server_ecdh_params(pmStack_18,&end,puVar6);
              if (iVar3 != 0) {
                mbedtls_debug_print_msg
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x85e,"bad server key exchange message");
                return -0x7b00;
              }
            }
          }
          if (((*(int *)(p + 0x18) == 2) || (*(int *)(p + 0x18) == 3)) || (*(int *)(p + 0x18) == 4))
          {
            params._4_4_ = MBEDTLS_MD_NONE;
            params._0_4_ = MBEDTLS_PK_NONE;
            puVar7 = pmStack_18->in_msg;
            sVar5 = mbedtls_ssl_hs_hdr_len(pmStack_18);
            puVar7 = puVar7 + sVar5;
            sVar5 = (long)end - (long)puVar7;
            if (pmStack_18->minor_ver == 3) {
              iVar3 = ssl_parse_signature_algorithm
                                (pmStack_18,&end,puVar6,(mbedtls_md_type_t *)((long)&params + 4),
                                 (mbedtls_pk_type_t *)&params);
              mVar1 = (mbedtls_pk_type_t)params;
              if (iVar3 != 0) {
                mbedtls_debug_print_msg
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x882,"bad server key exchange message");
                return -0x7b00;
              }
              mVar4 = mbedtls_ssl_get_ciphersuite_sig_pk_alg((mbedtls_ssl_ciphersuite_t *)p);
              if (mVar1 != mVar4) {
                mbedtls_debug_print_msg
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x888,"bad server key exchange message");
                return -0x7b00;
              }
            }
            else {
              if (2 < pmStack_18->minor_ver) {
                mbedtls_debug_print_msg
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x89b,"should never happen");
                return -0x6c00;
              }
              params._0_4_ = mbedtls_ssl_get_ciphersuite_sig_pk_alg((mbedtls_ssl_ciphersuite_t *)p);
              if (((mbedtls_pk_type_t)params == MBEDTLS_PK_ECDSA) &&
                 (params._4_4_ == MBEDTLS_MD_NONE)) {
                params._4_4_ = MBEDTLS_MD_SHA1;
              }
            }
            len = (size_t)(int)(uint)CONCAT11(*end,end[1]);
            end = end + 2;
            if (puVar6 != end + len) {
              mbedtls_debug_print_msg
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0x8a7,"bad server key exchange message");
              return -0x7b00;
            }
            mbedtls_debug_print_buf
                      (pmStack_18,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x8ab,"signature",end,len);
            if (params._4_4_ == MBEDTLS_MD_NONE) {
              mbedtls_md5_init((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38));
              mbedtls_sha1_init((mbedtls_sha1_context *)((long)&ctx.hmac_ctx + 4));
              hash[0x38] = '$';
              hash[0x39] = '\0';
              hash[0x3a] = '\0';
              hash[0x3b] = '\0';
              hash[0x3c] = '\0';
              hash[0x3d] = '\0';
              hash[0x3e] = '\0';
              hash[0x3f] = '\0';
              mbedtls_md5_starts((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38));
              mbedtls_md5_update((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38),
                                 pmStack_18->handshake->randbytes,0x40);
              mbedtls_md5_update((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38),puVar7,sVar5);
              mbedtls_md5_finish((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38),
                                 (uchar *)&pk_alg);
              mbedtls_sha1_starts((mbedtls_sha1_context *)((long)&ctx.hmac_ctx + 4));
              mbedtls_sha1_update((mbedtls_sha1_context *)((long)&ctx.hmac_ctx + 4),
                                  pmStack_18->handshake->randbytes,0x40);
              mbedtls_sha1_update((mbedtls_sha1_context *)((long)&ctx.hmac_ctx + 4),puVar7,sVar5);
              mbedtls_sha1_finish((mbedtls_sha1_context *)((long)&ctx.hmac_ctx + 4),hash + 8);
              mbedtls_md5_free((mbedtls_md5_context *)(mbedtls_sha1.buffer + 0x38));
              mbedtls_sha1_free((mbedtls_sha1_context *)((long)&ctx.hmac_ctx + 4));
            }
            else {
              if (params._4_4_ == MBEDTLS_MD_NONE) {
                mbedtls_debug_print_msg
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x8fc,"should never happen");
                return -0x6c00;
              }
              mbedtls_md_init((mbedtls_md_context_t *)local_170);
              hash[0x38] = '\0';
              hash[0x39] = '\0';
              hash[0x3a] = '\0';
              hash[0x3b] = '\0';
              hash[0x3c] = '\0';
              hash[0x3d] = '\0';
              hash[0x3e] = '\0';
              hash[0x3f] = '\0';
              pmVar8 = mbedtls_md_info_from_type(params._4_4_);
              ciphersuite_info._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)local_170,pmVar8,0);
              if (ciphersuite_info._4_4_ != 0) {
                mbedtls_debug_print_ret
                          (pmStack_18,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                           ,0x8ee,"mbedtls_md_setup",ciphersuite_info._4_4_);
                return ciphersuite_info._4_4_;
              }
              mbedtls_md_starts((mbedtls_md_context_t *)local_170);
              mbedtls_md_update((mbedtls_md_context_t *)local_170,pmStack_18->handshake->randbytes,
                                0x40);
              mbedtls_md_update((mbedtls_md_context_t *)local_170,puVar7,sVar5);
              mbedtls_md_finish((mbedtls_md_context_t *)local_170,(uchar *)&pk_alg);
              mbedtls_md_free((mbedtls_md_context_t *)local_170);
            }
            ssl_00 = pmStack_18;
            if (hash._56_8_ == 0) {
              pmVar8 = mbedtls_md_info_from_type(params._4_4_);
              bVar2 = mbedtls_md_get_size(pmVar8);
              local_1a0 = (size_t)bVar2;
            }
            else {
              local_1a0._0_1_ = hash[0x38];
              local_1a0._1_1_ = hash[0x39];
              local_1a0._2_1_ = hash[0x3a];
              local_1a0._3_1_ = hash[0x3b];
              local_1a0._4_1_ = hash[0x3c];
              local_1a0._5_1_ = hash[0x3d];
              local_1a0._6_1_ = hash[0x3e];
              local_1a0._7_1_ = hash[0x3f];
            }
            mbedtls_debug_print_buf
                      (ssl_00,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x901,"parameters hash",(uchar *)&pk_alg,local_1a0);
            if (pmStack_18->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0) {
              mbedtls_debug_print_msg
                        (pmStack_18,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0x905,"certificate required");
              return -0x7700;
            }
            iVar3 = mbedtls_pk_can_do(&pmStack_18->session_negotiate->peer_cert->pk,
                                      (mbedtls_pk_type_t)params);
            if (iVar3 == 0) {
              mbedtls_debug_print_msg
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0x90e,"bad server key exchange message");
              return -0x6d00;
            }
            ciphersuite_info._4_4_ =
                 mbedtls_pk_verify(&pmStack_18->session_negotiate->peer_cert->pk,params._4_4_,
                                   (uchar *)&pk_alg,hash._56_8_,end,len);
            if (ciphersuite_info._4_4_ != 0) {
              mbedtls_debug_print_ret
                        (pmStack_18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                         ,0x915,"mbedtls_pk_verify",ciphersuite_info._4_4_);
              return ciphersuite_info._4_4_;
            }
            ciphersuite_info._4_4_ = 0;
          }
        }
        else {
          if ((*(int *)(p + 0x18) != 5) && (*(int *)(p + 0x18) != 7)) {
            mbedtls_debug_print_msg
                      (pmStack_18,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                       ,0x829,"bad server key exchange message");
            return -0x7700;
          }
          pmStack_18->record_read = 1;
        }
        pmStack_18->state = pmStack_18->state + 1;
        mbedtls_debug_print_msg
                  (pmStack_18,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x920,"<= parse server key exchange");
        ssl_local._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_msg
                  (pmStack_18,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                   ,0x818,"bad server key exchange message");
        ssl_local._4_4_ = -0x7700;
      }
    }
    else {
      mbedtls_debug_print_ret
                (pmStack_18,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x812,"mbedtls_ssl_read_record",ciphersuite_info._4_4_);
      ssl_local._4_4_ = ciphersuite_info._4_4_;
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_server_key_exchange( mbedtls_ssl_context *ssl )
{
    int ret;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;
    unsigned char *p, *end;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server key exchange" ) );

#if defined(MBEDTLS_KEY_EXCHANGE_RSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif

#if defined(MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED) || \
    defined(MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA )
    {
        if( ( ret = ssl_get_ecdh_params_from_cert( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_get_ecdh_params_from_cert", ret );
            return( ret );
        }

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip parse server key exchange" ) );
        ssl->state++;
        return( 0 );
    }
    ((void) p);
    ((void) end);
#endif /* MBEDTLS_KEY_EXCHANGE_ECDH_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDH_ECDSA_ENABLED */

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /*
     * ServerKeyExchange may be skipped with PSK and RSA-PSK when the server
     * doesn't use a psk_identity_hint
     */
    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_SERVER_KEY_EXCHANGE )
    {
        if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
            ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        {
            ssl->record_read = 1;
            goto exit;
        }

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    p   = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
    end = ssl->in_msg + ssl->in_hslen;
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server key exchange", p, end - p );

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        if( ssl_parse_server_psk_hint( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    } /* FALLTROUGH */
#endif /* MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED */

#if defined(MBEDTLS_KEY_EXCHANGE_PSK_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_RSA_PSK )
        ; /* nothing more to do */
    else
#endif /* MBEDTLS_KEY_EXCHANGE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_RSA_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK )
    {
        if( ssl_parse_server_dh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_DHE_PSK_ENABLED */
#if defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        if( ssl_parse_server_ecdh_params( ssl, &p, end ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }
    }
    else
#endif /* MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_PSK_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED) ||                       \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED) ||                     \
    defined(MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED)
    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_RSA ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA )
    {
        size_t sig_len, hashlen;
        unsigned char hash[64];
        mbedtls_md_type_t md_alg = MBEDTLS_MD_NONE;
        mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
        unsigned char *params = ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl );
        size_t params_len = p - params;

        /*
         * Handle the digitally-signed structure
         */
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            if( ssl_parse_signature_algorithm( ssl, &p, end,
                                               &md_alg, &pk_alg ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }

            if( pk_alg != mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info ) )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
                return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
            }
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
        {
            pk_alg = mbedtls_ssl_get_ciphersuite_sig_pk_alg( ciphersuite_info );

            /* Default hash for ECDSA is SHA-1 */
            if( pk_alg == MBEDTLS_PK_ECDSA && md_alg == MBEDTLS_MD_NONE )
                md_alg = MBEDTLS_MD_SHA1;
        }
        else
#endif
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        /*
         * Read signature
         */
        sig_len = ( p[0] << 8 ) | p[1];
        p += 2;

        if( end != p + sig_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "signature", p, sig_len );

        /*
         * Compute the hash that has been signed
         */
#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_1)
        if( md_alg == MBEDTLS_MD_NONE )
        {
            mbedtls_md5_context mbedtls_md5;
            mbedtls_sha1_context mbedtls_sha1;

            mbedtls_md5_init(  &mbedtls_md5  );
            mbedtls_sha1_init( &mbedtls_sha1 );

            hashlen = 36;

            /*
             * digitally-signed struct {
             *     opaque md5_hash[16];
             *     opaque sha_hash[20];
             * };
             *
             * md5_hash
             *     MD5(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             * sha_hash
             *     SHA(ClientHello.random + ServerHello.random
             *                            + ServerParams);
             */
            mbedtls_md5_starts( &mbedtls_md5 );
            mbedtls_md5_update( &mbedtls_md5, ssl->handshake->randbytes, 64 );
            mbedtls_md5_update( &mbedtls_md5, params, params_len );
            mbedtls_md5_finish( &mbedtls_md5, hash );

            mbedtls_sha1_starts( &mbedtls_sha1 );
            mbedtls_sha1_update( &mbedtls_sha1, ssl->handshake->randbytes, 64 );
            mbedtls_sha1_update( &mbedtls_sha1, params, params_len );
            mbedtls_sha1_finish( &mbedtls_sha1, hash + 16 );

            mbedtls_md5_free(  &mbedtls_md5  );
            mbedtls_sha1_free( &mbedtls_sha1 );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_SSL3 || MBEDTLS_SSL_PROTO_TLS1 || \
          MBEDTLS_SSL_PROTO_TLS1_1 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( md_alg != MBEDTLS_MD_NONE )
        {
            mbedtls_md_context_t ctx;

            mbedtls_md_init( &ctx );

            /* Info from md_alg will be used instead */
            hashlen = 0;

            /*
             * digitally-signed struct {
             *     opaque client_random[32];
             *     opaque server_random[32];
             *     ServerDHParams params;
             * };
             */
            if( ( ret = mbedtls_md_setup( &ctx,
                                     mbedtls_md_info_from_type( md_alg ), 0 ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
                return( ret );
            }

            mbedtls_md_starts( &ctx );
            mbedtls_md_update( &ctx, ssl->handshake->randbytes, 64 );
            mbedtls_md_update( &ctx, params, params_len );
            mbedtls_md_finish( &ctx, hash );
            mbedtls_md_free( &ctx );
        }
        else
#endif /* MBEDTLS_SSL_PROTO_TLS1 || MBEDTLS_SSL_PROTO_TLS1_1 || \
          MBEDTLS_SSL_PROTO_TLS1_2 */
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 3, "parameters hash", hash, hashlen != 0 ? hashlen :
            (unsigned int) ( mbedtls_md_get_size( mbedtls_md_info_from_type( md_alg ) ) ) );

        if( ssl->session_negotiate->peer_cert == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "certificate required" ) );
            return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
        }

        /*
         * Verify signature
         */
        if( ! mbedtls_pk_can_do( &ssl->session_negotiate->peer_cert->pk, pk_alg ) )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server key exchange message" ) );
            return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
        }

        if( ( ret = mbedtls_pk_verify( &ssl->session_negotiate->peer_cert->pk,
                               md_alg, hash, hashlen, p, sig_len ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_pk_verify", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_KEY_EXCHANGE_DHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_RSA_ENABLED ||
          MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA_ENABLED */

exit:
    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server key exchange" ) );

    return( 0 );
}